

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargePropagator.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargePropagator::~FluctuatingChargePropagator(FluctuatingChargePropagator *this)

{
  FluctuatingChargeConstraints *this_00;
  
  this->_vptr_FluctuatingChargePropagator = (_func_int **)&PTR__FluctuatingChargePropagator_002c13f8
  ;
  if ((this->info_->usesFluctuatingCharges_ == true) &&
     (0 < this->info_->nGlobalFluctuatingCharges_)) {
    this_00 = this->fqConstraints_;
    if (this_00 != (FluctuatingChargeConstraints *)0x0) {
      FluctuatingChargeConstraints::~FluctuatingChargeConstraints(this_00);
    }
    operator_delete(this_00,0x88);
    return;
  }
  return;
}

Assistant:

FluctuatingChargePropagator::~FluctuatingChargePropagator() {
    if (info_->usesFluctuatingCharges() && info_->getNFluctuatingCharges() > 0)
      delete fqConstraints_;
  }